

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

void __thiscall
pbrt::WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D
          (WindowedPiecewiseConstant2D *this,Allocator alloc)

{
  Array2D<float> *in_RSI;
  SummedAreaTable *in_RDI;
  allocator_type unaff_retaddr;
  Allocator in_stack_ffffffffffffffd0;
  
  SummedAreaTable::SummedAreaTable(in_RDI,in_stack_ffffffffffffffd0);
  Array2D<float>::Array2D(in_RSI,unaff_retaddr);
  return;
}

Assistant:

WindowedPiecewiseConstant2D(Allocator alloc) : sat(alloc), func(alloc) {}